

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O1

Argument * __thiscall
argparse::ArgumentParser::add_argument<char_const*,char_const*>
          (ArgumentParser *this,char *Fargs,char *Fargs_1)

{
  size_t *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  _Node *p_Var3;
  __off64_t *in_R8;
  size_t in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *mName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  add_const_t<std::vector<std::__cxx11::basic_string<char>_>_> *__range2;
  uint in_stack_ffffffffffffffb8;
  _List_iterator<argparse::Argument> local_40;
  char *local_38;
  char *local_30;
  
  local_38 = Fargs_1;
  local_30 = Fargs;
  p_Var3 = std::__cxx11::list<argparse::Argument,std::allocator<argparse::Argument>>::
           _M_create_node<char_const*,char_const*>
                     ((list<argparse::Argument,std::allocator<argparse::Argument>> *)
                      &this->mOptionalArguments,&local_30,&local_38);
  std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
  psVar1 = &(this->mOptionalArguments).
            super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl.
            _M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (((p_Var3->_M_storage)._M_storage[0xbc] & 1) == 0) {
    std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::splice
              (&this->mPositionalArguments,(int)&this->mPositionalArguments,
               (__off64_t *)&this->mOptionalArguments,(int)p_Var3,in_R8,in_R9,
               in_stack_ffffffffffffffb8);
  }
  __args = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
            (p_Var3->_M_storage)._M_storage;
  pbVar2 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
            ((p_Var3->_M_storage)._M_storage + 8);
  if (__args != pbVar2) {
    local_40._M_node = &p_Var3->super__List_node_base;
    do {
      std::
      _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,std::_List_iterator<argparse::Argument>&>
                ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>
                  *)&this->mArgumentMap,__args,&local_40);
      __args = __args + 1;
    } while (__args != pbVar2);
  }
  return (Argument *)&p_Var3->_M_storage;
}

Assistant:

Argument &add_argument(Targs... Fargs) {
    auto tArgument = mOptionalArguments.emplace(cend(mOptionalArguments),
                                                std::move(Fargs)...);

    if (!tArgument->mIsOptional)
      mPositionalArguments.splice(cend(mPositionalArguments),
                                  mOptionalArguments, tArgument);

    index_argument(tArgument);
    return *tArgument;
  }